

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

int forkal(int ip,int iq,int id,double *phi,double *theta,double *delta,int N,double *W,
          double *resid,int il,double *Y,double *AMSE)

{
  double dVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *__s;
  ulong uVar5;
  double *pdVar6;
  undefined4 in_register_00000014;
  long lVar7;
  undefined4 in_register_00000034;
  double *pdVar8;
  int iVar9;
  undefined4 in_register_0000003c;
  long lVar10;
  double *pdVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  size_t sVar15;
  ulong uVar16;
  double *pdVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  bool bVar22;
  double dVar23;
  double extraout_XMM0_Qa;
  double dVar24;
  double dVar25;
  double dVar26;
  double local_1e0;
  double sumlog;
  double ssq;
  int nit;
  int iter;
  size_t local_1c0;
  double *local_1b8;
  double *local_1b0;
  long local_1a8;
  double *local_1a0;
  long local_198;
  size_t local_190;
  long local_188;
  double *local_180;
  double *local_178;
  long local_170;
  long local_168;
  double *local_160;
  size_t local_158;
  long local_150;
  long local_148;
  ulong local_140;
  double *local_138;
  ulong local_130;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  ulong local_110;
  double *local_108;
  ulong local_100;
  ulong local_f8;
  long local_f0;
  double *local_e8;
  ulong local_e0;
  void *local_d8;
  double *local_d0;
  long local_c8;
  undefined8 local_c0;
  ulong local_b8;
  int local_b0;
  int local_ac;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  double *local_90;
  double *local_88;
  double *local_80;
  double local_78;
  ulong local_70;
  double local_68;
  double *local_60;
  ulong local_58;
  ulong local_50;
  void *local_48;
  double local_40;
  char local_31;
  
  local_c0 = CONCAT44(in_register_0000003c,ip);
  local_70 = CONCAT44(in_register_00000034,iq);
  local_50 = CONCAT44(in_register_00000014,id);
  local_100 = (ulong)(uint)il;
  uVar21 = iq + 1U;
  if ((int)(iq + 1U) <= ip) {
    uVar21 = ip;
  }
  local_40 = (double)(ulong)uVar21;
  iVar2 = 4;
  if (iq * iq != 0 || ip * ip != 0) {
    iVar2 = (iq >> 0x1f) * -2 - (ip >> 0x1f);
  }
  iVar19 = 8;
  if (-1 < id) {
    iVar19 = iVar2;
  }
  local_114 = 0xb;
  if (0 < il) {
    local_114 = iVar19;
  }
  if (local_114 == 0) {
    local_110 = CONCAT44(local_110._4_4_,uVar21 + 1);
    iVar2 = (uVar21 + 1) * uVar21;
    local_58 = CONCAT44(local_58._4_4_,iVar2);
    uVar14 = iVar2 / 2;
    uVar13 = uVar21 + id;
    local_ac = uVar21 + id + 1;
    local_68 = (double)CONCAT44(local_68._4_4_,local_ac * uVar13);
    uVar21 = (int)(local_ac * uVar13) / 2;
    lVar7 = (long)(int)uVar13;
    local_108 = theta;
    local_90 = phi;
    local_88 = delta;
    local_80 = (double *)malloc(lVar7 * 8);
    local_a8 = (ulong)uVar21;
    local_60 = (double *)malloc((long)(int)uVar21 << 3);
    sVar15 = (long)(int)uVar14 << 3;
    local_a0 = (ulong)uVar14;
    local_d0 = (double *)malloc(sVar15);
    pvVar4 = malloc(lVar7 * 8);
    __s = malloc(sVar15);
    local_c8 = lVar7;
    if (0 < (int)uVar13) {
      sVar15 = (ulong)(uVar13 - 1) * 8 + 8;
      memset(local_80,0,sVar15);
      memset(pvVar4,0,sVar15);
    }
    pdVar8 = local_60;
    local_e0 = (ulong)uVar13;
    local_48 = pvVar4;
    if (1 < local_68._0_4_) {
      memset(local_60,0,(ulong)((int)local_a8 - 1) * 8 + 8);
    }
    pdVar6 = local_90;
    pdVar11 = local_d0;
    if (1 < (int)local_58) {
      sVar15 = (ulong)((int)local_a0 - 1) * 8 + 8;
      memset(local_d0,0,sVar15);
      memset(__s,0,sVar15);
    }
    *local_80 = 0.0;
    *pdVar11 = 1.0;
    local_d8 = __s;
    if (local_40._0_4_ == 1) {
      dVar23 = *pdVar6;
      dVar23 = dVar23 * dVar23;
      *pdVar8 = 1.0 / (1.0 - dVar23);
    }
    else {
      starma((int)local_c0,(int)local_70,pdVar6,local_108,local_80,pdVar8,pdVar11);
      dVar23 = extraout_XMM0_Qa;
    }
    iVar2 = (int)local_50;
    uVar21 = N - iVar2;
    local_b8 = local_50 & 0xffffffff;
    if (iVar2 != 0) {
      if (0 < iVar2) {
        iVar19 = N + -2;
        uVar5 = 0;
        do {
          dVar23 = W[iVar19];
          *(double *)((long)local_48 + uVar5 * 8) = dVar23;
          iVar19 = iVar19 + -1;
          uVar5 = uVar5 + 1;
        } while (local_b8 != uVar5);
      }
      if (0 < (int)uVar21) {
        pdVar8 = W + iVar2;
        uVar5 = 1;
        do {
          dVar23 = 0.0;
          if (0 < iVar2) {
            lVar7 = -1;
            pdVar11 = local_88;
            do {
              dVar23 = dVar23 - *pdVar11 * pdVar8[lVar7];
              pdVar11 = pdVar11 + 1;
              lVar7 = lVar7 + -1;
            } while (-lVar7 != (ulong)(iVar2 + 1));
          }
          dVar23 = dVar23 + W[uVar5 + (long)iVar2 + -1];
          W[uVar5 - 1] = dVar23;
          uVar5 = uVar5 + 1;
          pdVar8 = pdVar8 + 1;
        } while (uVar5 != uVar21 + 1);
      }
    }
    sumlog = 0.0;
    local_1e0 = 0.0;
    ssq._0_4_ = 0;
    ssq._4_4_ = 0;
    karma((int)local_c0,(int)local_70,local_90,(double *)0x0,local_80,local_60,local_d0,uVar21,W,
          resid,&local_1e0,&sumlog,1,dVar23,(int *)((long)&ssq + 4),(int *)&ssq);
    pdVar8 = local_60;
    if ((int)uVar21 < 1) {
      dVar23 = 0.0;
    }
    else {
      dVar23 = 0.0;
      uVar5 = 0;
      do {
        dVar23 = dVar23 + resid[uVar5] * resid[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar21 != uVar5);
    }
    local_70 = (ulong)(int)local_110;
    iVar2 = SUB84(local_40,0);
    local_f8 = (ulong)local_40 & 0xffffffff;
    pdVar11 = local_90;
    dVar24 = local_40;
    if ((int)local_50 != 0) {
      local_78 = dVar23;
      if (1 < (int)local_58) {
        memcpy(local_d8,local_60,(ulong)((int)local_a0 - 1) * 8 + 8);
      }
      local_58 = (ulong)uVar21;
      if (1 < local_68._0_4_) {
        memset(pdVar8,0,(ulong)((int)local_a8 - 1) * 8 + 8);
      }
      pvVar4 = local_d8;
      if (0 < iVar2) {
        iVar2 = 0;
        iVar19 = 0;
        uVar5 = 0;
        dVar23 = local_40;
        do {
          uVar16 = uVar5 + 1;
          local_68 = (double)(ulong)(SUB84(dVar23,0) - 1);
          memcpy(pdVar8 + (iVar2 - ((int)uVar5 * (int)uVar16) / 2),
                 (void *)((long)pvVar4 + (long)iVar19 * 8),(long)local_68 * 8 + 8);
          iVar19 = iVar19 + SUB84(dVar23,0);
          iVar2 = iVar2 + local_ac;
          uVar5 = uVar16;
          pdVar8 = local_60;
          dVar23 = local_68;
        } while (local_f8 != uVar16);
      }
      dVar24 = local_40;
      pdVar11 = local_90;
      uVar21 = (uint)local_58;
      dVar23 = local_78;
      if (0 < (int)local_50) {
        memcpy(local_80 + (local_70 - 1),local_48,local_b8 * 8);
        dVar23 = local_78;
      }
    }
    pdVar8 = local_60;
    if (0 < il) {
      dVar23 = dVar23 / (double)(int)uVar21;
      iVar2 = (int)local_e0;
      local_130 = (ulong)(uint)(iVar2 * 2);
      iVar19 = iVar2 * 2 + 1;
      local_120 = (int)local_50;
      iVar3 = SUB84(dVar24,0);
      iVar12 = (((int)local_70 + local_120 * 2) * iVar3) / 2;
      local_a8 = CONCAT44(local_a8._4_4_,iVar19);
      local_b0 = ((iVar19 - iVar3) * iVar3) / 2;
      local_108 = (double *)CONCAT44(local_108._4_4_,iVar2 * 2 + 2);
      local_1c0 = (ulong)(iVar3 - 1) << 3;
      local_160 = local_60 + (local_70 - 1);
      local_e0 = (ulong)(iVar2 + 2);
      local_100 = (ulong)((int)local_100 + 1);
      dVar25 = *local_80;
      local_a0 = local_70 & 0xffffffff;
      local_31 = iVar3 < 1 || local_120 == 1;
      _nit = (ulong)((int)local_c0 + 1) - 1;
      local_1b0 = local_80 + local_c8;
      local_1a8 = -local_b8;
      local_198 = (long)local_48 + 8;
      local_124 = local_120 * 2 + 1;
      local_118 = local_120 * 2 + 1;
      local_70 = CONCAT44(local_70._4_4_,local_120 * 2 + 2);
      local_58 = (ulong)iVar3;
      local_c8 = CONCAT44(local_c8._4_4_,iVar12);
      local_f0 = (long)iVar12;
      local_1b8 = local_80 + 1;
      local_110 = (ulong)(local_120 + 1);
      local_158 = local_b8 * 8;
      local_190 = local_f8 * 8;
      local_138 = local_80 + local_58;
      local_98 = local_110 - 1;
      local_e8 = local_60 + local_58;
      local_150 = local_f0 + 1;
      local_148 = local_b8 - 1;
      local_180 = local_60 + -2;
      local_120 = local_120 + -1;
      local_11c = iVar2 * 2 - 1;
      local_168 = local_a0 - 1;
      local_188 = local_f8 - 1;
      local_178 = local_88 + 1;
      local_170 = local_110 - 2;
      local_1a0 = local_60 + 1;
      uVar5 = 1;
      local_78 = dVar23;
      do {
        pdVar6 = local_88;
        iVar2 = (int)local_50;
        iVar19 = SUB84(dVar24,0);
        local_140 = uVar5;
        if (1 < iVar19) {
          local_68 = dVar25;
          memmove(local_80,local_1b8,local_1c0);
          iVar2 = (int)local_50;
          dVar25 = local_68;
          dVar23 = local_78;
        }
        local_80[local_58 - 1] = 0.0;
        if (0 < (int)local_c0) {
          lVar7 = 0;
          do {
            local_80[lVar7] = pdVar11[lVar7] * dVar25 + local_80[lVar7];
            lVar7 = lVar7 + 1;
          } while (_nit != lVar7);
        }
        if (iVar2 == 0) {
LAB_001138b2:
          if (0 < iVar19) {
            memcpy(local_48,pdVar8,local_190);
            dVar24 = *pdVar8;
            uVar16 = 1;
            iVar2 = 0;
            pdVar6 = pdVar11;
            lVar7 = local_198;
            lVar10 = local_188;
            uVar5 = local_58;
            dVar25 = local_40;
            pdVar17 = pdVar8;
            do {
              iVar19 = (int)uVar16;
              dVar23 = pdVar11[uVar16 - 1];
              iVar12 = ((iVar19 + -1) * ((int)local_108 - iVar19)) / 2;
              iVar19 = (((int)local_a8 - iVar19) * iVar19) / 2;
              lVar20 = 0;
              pdVar8 = pdVar17;
              do {
                dVar1 = pdVar6[lVar20];
                dVar26 = dVar1 * dVar24 * dVar23 + local_d0[iVar2 + lVar20];
                pdVar17[iVar12 + lVar20] = dVar26;
                if ((long)uVar16 < (long)local_58) {
                  dVar26 = dVar26 + dVar1 * *(double *)((long)local_48 + uVar16 * 8);
                  pdVar17[iVar12 + lVar20] = dVar26;
                }
                if (lVar10 != lVar20) {
                  lVar18 = (long)iVar19;
                  iVar19 = iVar19 + 1;
                  pdVar17[iVar12 + lVar20] =
                       dVar26 + *(double *)(lVar7 + lVar20 * 8) * dVar23 + local_60[lVar18];
                  pdVar8 = local_60;
                }
                lVar20 = lVar20 + 1;
              } while ((int)uVar5 != (int)lVar20);
              uVar16 = uVar16 + 1;
              iVar2 = iVar2 + SUB84(dVar25,0);
              dVar25 = (double)(ulong)(SUB84(dVar25,0) - 1);
              uVar5 = uVar5 - 1;
              lVar10 = lVar10 + -1;
              lVar7 = lVar7 + 8;
              pdVar6 = pdVar6 + 1;
              pdVar17 = pdVar8;
              dVar23 = local_78;
            } while (uVar16 != local_a0);
          }
        }
        else {
          if (iVar2 < 1) {
            local_80[local_58] = dVar25;
LAB_0011367b:
            pdVar8[local_f0] = *pdVar8;
          }
          else {
            lVar7 = 0;
            do {
              dVar25 = dVar25 + pdVar6[lVar7] * local_138[lVar7];
              lVar7 = lVar7 + 1;
            } while (local_98 != lVar7);
            if (1 < iVar2) {
              lVar7 = -1;
              do {
                local_1b0[lVar7] = local_1b0[lVar7 + -1];
                lVar7 = lVar7 + -1;
              } while (local_1a8 != lVar7);
            }
            local_80[local_58] = dVar25;
            if (iVar2 < 1) goto LAB_0011367b;
            uVar5 = 1;
            do {
              pdVar6 = local_60;
              *(undefined8 *)((long)local_48 + uVar5 * 8 + -8) = 0;
              local_68 = 0.0;
              uVar16 = 1;
              iVar2 = (int)local_c8;
              do {
                iVar19 = imax((int)uVar5,(int)uVar16);
                iVar12 = imin((int)uVar5,(int)uVar16);
                pdVar8 = local_60;
                pdVar11 = local_90;
                local_68 = local_68 +
                           local_88[uVar16 - 1] *
                           pdVar6[((iVar19 + iVar2) - iVar12) +
                                  (((int)local_70 - iVar12) * (iVar12 + -1)) / 2];
                *(double *)((long)local_48 + uVar5 * 8 + -8) = local_68;
                uVar16 = uVar16 + 1;
              } while (local_110 != uVar16);
              uVar5 = uVar5 + 1;
            } while (uVar5 != local_110);
            iVar2 = (int)local_50;
            iVar19 = SUB84(local_40,0);
            dVar23 = local_78;
            if (iVar2 == 1) {
              dVar24 = *local_60;
              local_60[local_f0] = dVar24;
LAB_00113621:
              lVar7 = 0;
              do {
                dVar24 = dVar24 + (local_e8[lVar7] + local_e8[lVar7] +
                                  *(double *)((long)local_48 + lVar7 * 8)) * local_88[lVar7];
                local_60[local_f0] = dVar24;
                lVar7 = lVar7 + 1;
              } while (local_98 != lVar7);
              if (0 < iVar2) {
                memcpy(local_48,local_160,local_158);
                dVar23 = local_78;
              }
            }
            else {
              if (iVar2 < 2) goto LAB_0011367b;
              iVar3 = 1;
              iVar12 = 2;
              do {
                iVar9 = iVar2 - iVar3;
                lVar7 = 0;
                do {
                  local_60[(((local_118 - iVar9) * iVar9) / 2 + (int)local_c8) + lVar7] =
                       local_60[((((int)local_70 - iVar9) * (iVar9 + -1)) / 2 + (int)local_c8) +
                                lVar7];
                  lVar7 = lVar7 + 1;
                } while (iVar3 != (int)lVar7);
                iVar3 = iVar3 + 1;
                bVar22 = iVar12 != iVar2;
                iVar12 = iVar12 + 1;
              } while (bVar22);
              if (1 < iVar2) {
                lVar7 = 0;
                do {
                  local_60[(int)local_150 + (int)lVar7] =
                       *(double *)((long)local_48 + lVar7 * 8) + local_e8[lVar7];
                  lVar7 = lVar7 + 1;
                } while (local_148 != lVar7);
              }
              dVar24 = *local_60;
              local_60[local_f0] = dVar24;
              if (0 < iVar2) goto LAB_00113621;
            }
          }
          if (0 < iVar19) {
            uVar5 = 1;
            do {
              iVar2 = (int)local_50;
              iVar19 = SUB84(local_40,0);
              if (0 < iVar2) {
                uVar21 = (uint)uVar5;
                iVar12 = (int)((uVar21 - 1) * ((int)local_130 - uVar21)) / 2 + iVar19;
                dVar24 = pdVar11[uVar5 - 1];
                lVar7 = 0;
                do {
                  dVar25 = *(double *)((long)local_48 + lVar7 * 8) * dVar24;
                  pdVar8[iVar12 + lVar7] = dVar25;
                  if (uVar5 != local_f8) {
                    pdVar8[iVar12 + lVar7] =
                         dVar25 + pdVar8[((int)((~uVar21 + (int)local_130) * uVar21) / 2 + iVar19) +
                                         lVar7];
                  }
                  lVar7 = lVar7 + 1;
                } while (local_98 != lVar7);
              }
              uVar5 = uVar5 + 1;
            } while (uVar5 != local_a0);
            if (0 < iVar19) {
              uVar5 = 1;
              do {
                *(undefined8 *)((long)local_48 + uVar5 * 8 + -8) = 0;
                if (0 < iVar2) {
                  dVar24 = 0.0;
                  lVar7 = 0;
                  do {
                    dVar24 = dVar24 + local_88[lVar7] *
                                      pdVar8[((((int)local_a8 - (int)uVar5) * (int)uVar5) / 2 -
                                             iVar2) + lVar7];
                    lVar7 = lVar7 + 1;
                  } while (local_98 != lVar7);
                  *(double *)((long)local_48 + uVar5 * 8 + -8) = dVar24;
                }
                uVar5 = uVar5 + 1;
              } while (uVar5 != local_a0);
              if (local_31 == '\0') {
                iVar3 = 4;
                uVar5 = 2;
                uVar16 = local_e0 & 0xffffffff;
                iVar12 = 1;
                do {
                  if (1 < iVar2) {
                    pdVar6 = local_180 + ((int)uVar16 - (int)(uVar5 >> 1));
                    iVar9 = local_120;
                    do {
                      *pdVar6 = pdVar6[-1];
                      pdVar6 = pdVar6 + -1;
                      iVar9 = iVar9 + -1;
                    } while (iVar9 != 0);
                  }
                  uVar16 = (ulong)(uint)((int)uVar16 + local_ac);
                  uVar5 = (ulong)(uint)((int)uVar5 + iVar3);
                  iVar3 = iVar3 + 2;
                  bVar22 = iVar12 != iVar19;
                  iVar12 = iVar12 + 1;
                } while (bVar22);
              }
              if (0 < iVar19) {
                lVar7 = 0;
                iVar2 = local_11c;
                do {
                  lVar10 = lVar7 + 1;
                  dVar24 = pdVar11[lVar7] * *pdVar8 + *(double *)((long)local_48 + lVar7 * 8);
                  iVar12 = ((int)lVar7 * iVar2) / 2 + iVar19;
                  pdVar8[iVar12] = dVar24;
                  if (lVar10 < (long)local_58) {
                    pdVar8[iVar12] = dVar24 + pdVar8[lVar7 + 1];
                  }
                  iVar2 = iVar2 + -1;
                  lVar7 = lVar10;
                } while (local_168 != lVar10);
                goto LAB_001138b2;
              }
            }
          }
        }
        dVar25 = *local_80;
        Y[local_140 - 1] = dVar25;
        iVar2 = (int)local_50;
        if (iVar2 < 1) {
          dVar24 = *pdVar8;
        }
        else {
          lVar7 = 0;
          dVar24 = dVar25;
          do {
            dVar24 = dVar24 + local_138[lVar7] * local_88[lVar7];
            Y[local_140 - 1] = dVar24;
            lVar7 = lVar7 + 1;
          } while (local_98 != lVar7);
          dVar24 = *pdVar8;
          if (0 < iVar2) {
            lVar7 = 0;
            iVar19 = local_124;
            do {
              dVar1 = local_88[lVar7];
              dVar24 = dVar24 + (dVar1 + dVar1) * local_e8[lVar7] +
                                pdVar8[((int)lVar7 * iVar19) / 2 + local_b0] * dVar1 * dVar1;
              lVar7 = lVar7 + 1;
              iVar19 = iVar19 + -1;
            } while (local_98 != lVar7);
            if (1 < iVar2) {
              uVar5 = 1;
              lVar7 = local_170;
              pdVar6 = local_178;
              do {
                iVar2 = (int)uVar5;
                lVar10 = uVar5 - 1;
                uVar5 = uVar5 + 1;
                lVar20 = 0;
                do {
                  dVar24 = dVar24 + (pdVar6[lVar20] + pdVar6[lVar20]) * local_88[lVar10] *
                                    local_1a0[(((iVar2 + -1) * ((int)local_70 - iVar2)) / 2 +
                                              local_b0) + lVar20];
                  lVar20 = lVar20 + 1;
                } while (lVar7 != lVar20);
                pdVar6 = pdVar6 + 1;
                lVar7 = lVar7 + -1;
              } while (uVar5 != local_b8);
            }
          }
        }
        AMSE[local_140 - 1] = dVar24 * dVar23;
        uVar5 = local_140 + 1;
        dVar24 = local_40;
      } while (uVar5 != local_100);
    }
    pvVar4 = local_48;
    free(local_80);
    free(pdVar8);
    free(local_d0);
    free(pvVar4);
    free(local_d8);
  }
  return local_114;
}

Assistant:

int forkal(int ip,int iq,int id,double *phi,double*theta,double *delta,int N,double *W,double *resid,int il,double *Y,double *AMSE) {
	int ifault,ir,np,k,nrbar,ird,irz;
	double *A,*P,*V,*store,*xrow;
	double zero, one, two,AA,del,sumlog,ssq,sigma,A1,dt,phij,phijdt,phii,AMS;
	int i,  j, ll, nt, nj, idk, iid,iupd,nit,iter,ind,irj;
	int ir2, ir1, id2r, id2r1, id1,idd1,idd2,i45,idrr1,iddr,jkl,jkl1,id2r2,ibc,l,iri1,jj;
	int lk, lk1,jklj,iri,kk1,k1,kk,kkk,ind1,ind2,jrj,j1,jrk;
	/*
C     C Translation of Fortran routine
C     ALGORITHM AS 182  APPL. STATIST. (1982) VOL.31, NO.2
C
C     Finite sample prediction from ARIMA processes.
C
C     Auxiliary routines required: KARMA & STARMA from AS 154 and
C     routines called by them: INCLU2 from ASR 17 (a slight variant on
C     AS 75, and REGRES from AS 75.
C*/
	ir = iq + 1;

	if (ir < ip) {
		ir = ip;
	}
	np = (ir * (ir + 1)) / 2;
	nrbar = (np * (np - 1)) / 2;
	ird = ir + id;
	irz = (ird * (ird + 1)) / 2;
	zero = 0.0;
	one = 1.0;
	two = 2.0;

	ifault = 0;

	if (ip < 0) {
		ifault = 1;
	}
	if (iq < 0) {
		ifault = ifault + 2;
	}
	if (ip*ip + iq*iq == 0) {
		ifault = 4;
	}
	if (id < 0) {
		ifault = 8;
	}
	if (il < 1) {
		ifault = 11;
	}
	if (ifault != 0) {
		return ifault;
	}

	A = (double*)malloc(sizeof(double)* ird);
	P = (double*)malloc(sizeof(double)* irz);
	V = (double*)malloc(sizeof(double)* np); 
	store = (double*)malloc(sizeof(double)* ird);
	xrow = (double*)malloc(sizeof(double)* np);

	//Initial Conditions for Kalman Filter

	for (i = 0; i < ird; ++i) {
		A[i] = zero;
		store[i] = zero;
	}
	for (i = 0; i < irz; ++i) {
		P[i] = zero;
	}
	for (i = 0; i < np; ++i) {
		V[i] = zero;
		xrow[i] = zero;
	}
	A[0] = zero;
	V[0] = one;
	/*

	if (np != 1) {
		for (i = 2; i <= np; ++i) {
			V[i-1] = zero;
		}
		if (iq != 0) {
			iq1 = iq + 1;
			for (i = 2; i <= iq1; ++i) {
				V[i-1] = theta[i - 2];
			}
			for (j = 1; j <= iq; ++j) {
				ll = j * (2 * ir + 1 - j) / 2;
				for (i = j; i <= iq; ++i) {
					lli = ll + i;
					V[lli-1] = theta[i-1] * theta[j-1]; // Error
				}
			}
		}
	}//130
*/
	//Find initial likelihood conditions.

	if (ir == 1) {
		*P = 1.0 / (1.0 - phi[0] * phi[0]);
	}
	else {
		starma(ip, iq, phi, theta,A, P, V);
	}

	//Calculate Data Transformations

	nt = N - id;

	if (id != 0) {
		for (j = 1; j <= id; ++j) {
			nj = N - j;
			store[j-1] = W[nj-1];
		}
		for (i = 1; i <= nt; ++i) {
			AA = zero;
			for (k = 1; k <= id; ++k) {
				idk = id + i - k;
				AA -= delta[k - 1] * W[idk - 1];
			}
			iid = i + id;
			W[i - 1] = W[iid - 1] + AA;
		}
	}//170

	//Evaluate likelihood to obtain final KF conditions
	sumlog = ssq = zero;
	del = -1.0;
	iupd = 1;
	nit = 0;
	iter = 0;

	karma(ip, iq, phi, theta, A, P, V, nt, W, resid, &sumlog, &ssq, iupd, del,&iter, &nit);

	//Calculate M.L.E. of sigma squared

	sigma = zero;

	for (j = 0; j < nt; ++j) {
		sigma += resid[j] * resid[j];
	}
	sigma = sigma / nt;
	//mdisplay(resid, 1, N);

	//Reset the initial A and P when differencing occurs

	if (id != 0) {
		for (i = 1; i <= np; ++i) {
			xrow[i-1] = P[i-1];
		}
		for (i = 1; i <= irz; ++i) {
			P[i-1] = zero;
		}
		ind = 0;
		for (j = 1; j <= ir; ++j) {
			k = (j - 1) * (id + ir + 1) - (j - 1) * j / 2;
			for (i = j; i <= ir; ++i) {
				ind++;
				k++;
				P[k - 1] = xrow[ind-1];
			}
		}

		for (j = 1; j <= id; ++j) {
			irj = ir + j;
			A[irj-1] = store[j-1];
		}

	}//250

	//Set up constants
	ir2 = ir + 1;
	ir1 = ir - 1;
	id1 = id - 1;
	id2r = 2 * ird;
	id2r1 = id2r - 1;
	idd1 = 2 * id + 1;
	idd2 = idd1 + 1;
	i45 = id2r + 1;
	idrr1 = ird + 1;
	iddr = 2 * id + ir;
	jkl = ir * (iddr + 1) / 2;
	jkl1 = jkl + 1;
	id2r2 = id2r + 2;
	ibc = ir * (i45 - ir) / 2;

	for (l = 1; l <= il; ++l) {
		//Predict A
		A1 = A[0];
		if (ir != 1) {
			for (i = 1; i <= ir1; ++i) {
				A[i-1] = A[i];
			}
		}//310
		A[ir-1] = zero;
		if (ip != 0) {
			for (j = 1; j <= ip; ++j) {
				A[j-1] += phi[j-1] * A1;
			}
		}//330
		if (id != 0) {
			for (j = 1; j <= id; ++j) {
				irj = ir + j;
				A1 += delta[j-1] * A[irj-1];
			}//340
			if (id >= 2) {
				for (i = 1; i <= id1; ++i) {
					iri1 = ird - i;
					A[iri1] = A[iri1-1];
				}
			}//360
			A[ir2 - 1] = A1;
		}//360

		//A[ir2-1] = A1;

		//Predict P

		if (id != 0) {
			for (i = 1; i <= id; ++i) {
				store[i-1] = zero;
				for (j = 1; j <= id; ++j) {
					ll = imax(i, j);
					k = imin(i, j);
					jj = jkl + (ll - k) + 1 + (k - 1) * (idd2 - k) / 2;
					store[i-1] += delta[j-1] * P[jj-1];
				}
			}//370

			if (id != 1) {
				for (j = 1; j <= id1; ++j) {
					jj = id - j;
					lk = (jj - 1) * (idd2 - jj) / 2 + jkl;
					lk1 = jj * (idd1 - jj) / 2 + jkl;
					for (i = 1; i <= j; ++i) {
						lk = lk + 1;
						lk1 = lk1 + 1;
						P[lk1-1] = P[lk-1];
					}
				}//380
				for (j = 1; j <= id1; ++j) {
					jklj = jkl1 + j;
					irj = ir + j;
					P[jklj - 1] = store[j - 1] + P[irj-1];
				}
			}//400

			P[jkl1 - 1] = P[0];

			for (i = 1; i <= id; ++i) {
				iri = ir + i;
				P[jkl1 - 1] += delta[i - 1] * (store[i - 1] + two * P[iri - 1]);
			}

			for (i = 1; i <= id; ++i) {
				iri = ir + i;
				store[i - 1] = P[iri - 1];
			}

			for (j = 1; j <= ir; ++j) {
				kk1 = j * (id2r1 - j) / 2 + ir;
				k1 = (j - 1) * (id2r - j) / 2 + ir;
				for (i = 1; i <= id; ++i) {
					kk = kk1 + i;
					k = k1 + i;
					P[k - 1] = phi[j - 1] * store[i - 1];
					if (j != ir) {
						P[k - 1] += P[kk - 1];
					}
				}
			}

			for (j = 1; j <= ir; ++j) {
				store[j - 1] = zero;
				kkk = j * (i45 - j) / 2 - id;
				for (i = 1; i <= id; ++i) {
					kkk++;
					store[j - 1] += delta[i - 1] * P[kkk - 1];
				}
			}//440

			if (id != 1) {
				for (j = 1; j <= ir; ++j) {
					k = j * idrr1 - j * (j + 1) / 2 + 1;
					for (i = 1; i <= id1; ++i) {
						k--;
						P[k - 1] = P[k - 2];
					}
				}
			}//460

			for (j = 1; j <= ir; ++j) {
				k = (j - 1) * (id2r - j) / 2 + ir + 1;
				P[k - 1] = store[j - 1] + phi[j - 1] * P[0];
				if (j < ir) {
					P[k - 1] += P[j];
				}
			}

		}//480

		for (i = 0; i < ir; ++i) {
			store[i] = P[i];
		}

		ind = 0;
		dt = P[0];
		for (j = 1; j <= ir; ++j) {
			phij = phi[j - 1];
			phijdt = phij * dt;
			ind2 = (j - 1) * (id2r2 - j) / 2;
			ind1 = j * (i45 - j) / 2;
			for (i = j; i <= ir; ++i) {
				ind++;
				ind2++;
				phii = phi[i - 1];
				P[ind2 - 1] = V[ind - 1] + phii * phijdt;
				if (j < ir) {
					P[ind2 - 1] += store[j] * phii;
				}
				if (i != ir) {
					ind1++;
					P[ind2 - 1] += store[i] * phij + P[ind1 - 1];
				}//500
			}
		}//500

		//Predict Y

		Y[l - 1] = A[0];
		if (id != 0) {
			for (j = 1; j <= id; ++j) {
				irj = ir + j;
				Y[l - 1] += A[irj - 1] * delta[j - 1];
			}
			//Calculate MSE of Y
		}//520
		AMS = P[0];
		if (id != 0) {
			for (j = 1; j <= id; ++j) {
				jrj = ibc + (j - 1) * (idd2 - j) / 2;
				irj = ir + j;
				AMS += (two * delta[j - 1] * P[irj - 1] + P[jrj] * delta[j - 1] * delta[j - 1]);
			}
			if (id != 1) {
				for (j = 1; j <= id1; ++j) {
					j1 = j + 1;
					jrk = ibc + 1 + (j - 1) * (idd2 - j) / 2;
					for (i = j1; i <= id; ++i) {
						jrk++;
						AMS += two * delta[i-1] * delta[j-1] * P[jrk-1];
					}
				}
			}//550
		}//550
		AMSE[l - 1] = AMS * sigma;

	}//560
	/*
	mdisplay(A, 1, ird);
	mdisplay(P, 1, irz);
	mdisplay(V, 1, np);
	mdisplay(store, 1, ird);
	mdisplay(xrow, 1, np);
	*/
	free(A);
	free(P);
	free(V);
	free(store);
	free(xrow);
	return ifault;
}